

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::RelationshipProperty::RelationshipProperty(RelationshipProperty *this)

{
  this->_authored = false;
  Relationship::Relationship(&this->_relationship);
  return;
}

Assistant:

RelationshipProperty() = default;